

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::GLEngine(GLEngine *this)

{
  Engine::Engine(&this->super_Engine);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR_checkError_0047e1e8;
  this->mainWindow = (GLFWwindow *)0x0;
  (this->registeredShaderPrograms)._M_h._M_buckets =
       &(this->registeredShaderPrograms)._M_h._M_single_bucket;
  (this->registeredShaderPrograms)._M_h._M_bucket_count = 1;
  (this->registeredShaderPrograms)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registeredShaderPrograms)._M_h._M_element_count = 0;
  (this->registeredShaderPrograms)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registeredShaderPrograms)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registeredShaderPrograms)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->registeredShaderRules)._M_h._M_buckets =
       &(this->registeredShaderRules)._M_h._M_single_bucket;
  (this->registeredShaderRules)._M_h._M_bucket_count = 1;
  (this->registeredShaderRules)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->registeredShaderRules)._M_h._M_element_count = 0;
  (this->registeredShaderRules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->registeredShaderRules)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->registeredShaderRules)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

GLEngine::GLEngine() {}